

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

void __thiscall wasm::TranslateToFuzzReader::setupTables(TranslateToFuzzReader *this)

{
  Module *pMVar1;
  Type __args_1;
  bool bVar2;
  Index IVar3;
  iterator iVar4;
  iterator iVar5;
  pointer pTVar6;
  iterator __first;
  iterator __last;
  long lVar7;
  pointer this_00;
  pointer puVar8;
  address64_t aVar9;
  Name NVar10;
  Name NVar11;
  Name name;
  uint64_t local_240;
  Type local_1d0;
  __uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_> local_1c8;
  Address local_1c0;
  Address local_1b8;
  string_view local_1b0;
  string_view local_1a0;
  unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> local_190;
  unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> tablePtr_1;
  Address max_1;
  Address initial_1;
  __normal_iterator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_*,_std::vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>_>
  local_158;
  __normal_iterator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_*,_std::vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>_>
  iter_1;
  Type local_148;
  Type exnref;
  Literal local_118;
  Const *local_100;
  __single_object segment;
  Type addressType;
  bool hasFuncrefElemSegment;
  Type local_b0;
  Type local_a8;
  Address local_a0;
  Address local_98;
  string_view local_90;
  string_view local_80;
  unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> local_70;
  unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> tablePtr;
  Address AStack_60;
  BasicType addressType_1;
  Address max;
  Address initial;
  __normal_iterator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_*,_std::vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>_>
  local_30;
  __normal_iterator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_*,_std::vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>_>
  iter;
  Type local_20;
  Type funcref;
  Table *table;
  TranslateToFuzzReader *this_local;
  
  funcref.id = 0;
  HeapType::HeapType((HeapType *)&iter,func);
  Type::Type(&local_20,(HeapType)iter._M_current,Nullable,Inexact);
  iVar4 = std::
          vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
          ::begin((vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                   *)(this->wasm + 0xa8));
  iVar5 = std::
          vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
          ::end((vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                 *)(this->wasm + 0xa8));
  local_30 = std::
             find_if<__gnu_cxx::__normal_iterator<std::unique_ptr<wasm::Table,std::default_delete<wasm::Table>>*,std::vector<std::unique_ptr<wasm::Table,std::default_delete<wasm::Table>>,std::allocator<std::unique_ptr<wasm::Table,std::default_delete<wasm::Table>>>>>,wasm::TranslateToFuzzReader::setupTables()::__0>
                       ((__normal_iterator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_*,_std::vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>_>
                         )iVar4._M_current,
                        (__normal_iterator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_*,_std::vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>_>
                         )iVar5._M_current,&local_20);
  initial.addr = (address64_t)
                 std::
                 vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                 ::end((vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                        *)(this->wasm + 0xa8));
  bVar2 = __gnu_cxx::operator!=
                    (&local_30,
                     (__normal_iterator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_*,_std::vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>_>
                      *)&initial);
  if (bVar2) {
    puVar8 = __gnu_cxx::
             __normal_iterator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_*,_std::vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>_>
             ::operator->(&local_30);
    funcref.id = (uintptr_t)
                 std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::get(puVar8);
  }
  else {
    IVar3 = upTo(this,10);
    Address::Address(&max,(ulong)IVar3);
    Address::Address(&stack0xffffffffffffffa0);
    bVar2 = oneIn(this,2);
    if (bVar2) {
      aVar9 = Address::operator_cast_to_unsigned_long(&max);
      IVar3 = upTo(this,4);
      Address::operator=(&stack0xffffffffffffffa0,aVar9 + IVar3);
    }
    else {
      Address::operator=(&stack0xffffffffffffffa0,0xffffffffffffffff);
    }
    tablePtr._M_t.super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
    super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl._4_4_ = i32;
    bVar2 = FeatureSet::hasMemory64((FeatureSet *)(this->wasm + 0x178));
    if ((bVar2) && (bVar2 = oneIn(this,2), bVar2)) {
      tablePtr._M_t.super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t.
      super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
      super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl._4_4_ = i64;
    }
    pMVar1 = this->wasm;
    Name::Name((Name *)&local_90,"fuzzing_table");
    local_80 = (string_view)Names::getValidTableName(pMVar1,(Name)local_90);
    local_98.addr = local_20.id;
    local_a0.addr = max.addr;
    local_a8.id = AStack_60.addr;
    Type::Type(&local_b0,
               tablePtr._M_t.super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>.
               _M_t.super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
               super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl._4_4_);
    NVar10.super_IString.str._M_str = (char *)local_80._M_len;
    NVar10.super_IString.str._M_len = (size_t)&local_70;
    Builder::makeTable(NVar10,(Type)local_80._M_str,local_98,local_a0,local_a8);
    pTVar6 = std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::operator->(&local_70);
    (pTVar6->super_Importable).super_Named.hasExplicitName = true;
    funcref.id = wasm::Module::addTable((unique_ptr *)this->wasm);
    std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::~unique_ptr(&local_70);
  }
  Name::operator=(&this->funcrefTableName,(Name *)funcref.id);
  __first = std::
            vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
            ::begin((vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                     *)(this->wasm + 0x60));
  __last = std::
           vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
           ::end((vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                  *)(this->wasm + 0x60));
  bVar2 = std::
          any_of<__gnu_cxx::__normal_iterator<std::unique_ptr<wasm::ElementSegment,std::default_delete<wasm::ElementSegment>>*,std::vector<std::unique_ptr<wasm::ElementSegment,std::default_delete<wasm::ElementSegment>>,std::allocator<std::unique_ptr<wasm::ElementSegment,std::default_delete<wasm::ElementSegment>>>>>,wasm::TranslateToFuzzReader::setupTables()::__1>
                    ((__normal_iterator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_*,_std::vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>_>
                      )__first._M_current,
                     (__normal_iterator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_*,_std::vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>_>
                      )__last._M_current,&local_20);
  segment._M_t.
  super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>._M_t.
  super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>.
  super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl =
       (__uniq_ptr_data<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>,_true,_true>
       )(this->funcrefTableName).super_IString.str._M_len;
  NVar11.super_IString.str._M_str =
       (char *)segment._M_t.
               super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
               ._M_t.
               super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
               .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
  NVar11.super_IString.str._M_len = (size_t)this->wasm;
  lVar7 = wasm::Module::getTable(NVar11);
  __args_1 = funcref;
  if (!bVar2) {
    Literal::makeFromInt32(&local_118,0,(Type)*(uintptr_t *)(lVar7 + 0x48));
    local_100 = Builder::makeConst(&this->builder,&local_118);
    std::make_unique<wasm::ElementSegment,wasm::Name&,wasm::Const*>
              ((Name *)&stack0xffffffffffffff08,(Const **)__args_1.id);
    wasm::Literal::~Literal(&local_118);
    this_00 = std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>::
              operator->((unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                          *)&stack0xffffffffffffff08);
    pMVar1 = this->wasm;
    Name::Name((Name *)&exnref,"elem$");
    NVar10 = Names::getValidElementSegmentName(pMVar1,(Name)_exnref);
    Named::setName(&this_00->super_Named,NVar10,false);
    wasm::Module::addElementSegment((unique_ptr *)this->wasm);
    std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>::~unique_ptr
              ((unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *)
               &stack0xffffffffffffff08);
  }
  bVar2 = FeatureSet::hasExceptionHandling((FeatureSet *)(this->wasm + 0x178));
  if (bVar2) {
    HeapType::HeapType((HeapType *)&iter_1,exn);
    Type::Type(&local_148,(HeapType)iter_1._M_current,Nullable,Inexact);
    iVar4 = std::
            vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
            ::begin((vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                     *)(this->wasm + 0xa8));
    iVar5 = std::
            vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
            ::end((vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                   *)(this->wasm + 0xa8));
    local_158 = std::
                find_if<__gnu_cxx::__normal_iterator<std::unique_ptr<wasm::Table,std::default_delete<wasm::Table>>*,std::vector<std::unique_ptr<wasm::Table,std::default_delete<wasm::Table>>,std::allocator<std::unique_ptr<wasm::Table,std::default_delete<wasm::Table>>>>>,wasm::TranslateToFuzzReader::setupTables()::__2>
                          ((__normal_iterator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_*,_std::vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>_>
                            )iVar4._M_current,
                           (__normal_iterator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_*,_std::vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>_>
                            )iVar5._M_current,&local_148);
    initial_1.addr =
         (address64_t)
         std::
         vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
         ::end((vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                *)(this->wasm + 0xa8));
    bVar2 = __gnu_cxx::operator!=
                      (&local_158,
                       (__normal_iterator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_*,_std::vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>_>
                        *)&initial_1);
    if (bVar2) {
      puVar8 = __gnu_cxx::
               __normal_iterator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_*,_std::vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>_>
               ::operator->(&local_158);
      pTVar6 = std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::get(puVar8);
      Name::operator=(&this->exnrefTableName,(Name *)pTVar6);
    }
    else {
      IVar3 = upTo(this,10);
      Address::Address(&max_1,(ulong)IVar3);
      bVar2 = oneIn(this,2);
      if (bVar2) {
        aVar9 = Address::operator_cast_to_unsigned_long(&max_1);
        IVar3 = upTo(this,4);
        local_240 = aVar9 + IVar3;
      }
      else {
        local_240 = 0xffffffffffffffff;
      }
      Address::Address((Address *)&tablePtr_1,local_240);
      pMVar1 = this->wasm;
      Name::Name((Name *)&local_1b0,"exnref_table");
      local_1a0 = (string_view)Names::getValidTableName(pMVar1,(Name)local_1b0);
      local_1b8.addr = local_148.id;
      local_1c0.addr = max_1.addr;
      local_1c8._M_t.super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
      super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl =
           (tuple<wasm::Table_*,_std::default_delete<wasm::Table>_>)
           (tuple<wasm::Table_*,_std::default_delete<wasm::Table>_>)
           tablePtr_1._M_t.super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>.
           _M_t.super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
           super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl;
      Type::Type(&local_1d0,i32);
      name.super_IString.str._M_str = (char *)local_1a0._M_len;
      name.super_IString.str._M_len = (size_t)&local_190;
      Builder::makeTable(name,(Type)local_1a0._M_str,local_1b8,local_1c0,
                         (Type)local_1c8._M_t.
                               super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>
                               .super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl);
      pTVar6 = std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::operator->
                         (&local_190);
      (pTVar6->super_Importable).super_Named.hasExplicitName = true;
      funcref.id = wasm::Module::addTable((unique_ptr *)this->wasm);
      Name::operator=(&this->exnrefTableName,(Name *)funcref.id);
      std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::~unique_ptr(&local_190);
    }
  }
  return;
}

Assistant:

void TranslateToFuzzReader::setupTables() {
  // Ensure a funcref element segment and table exist. Segments with more
  // specific function types may have a smaller chance of getting functions.
  Table* table = nullptr;
  Type funcref = Type(HeapType::func, Nullable);
  auto iter = std::find_if(wasm.tables.begin(),
                           wasm.tables.end(),
                           [&](auto& table) { return table->type == funcref; });
  if (iter != wasm.tables.end()) {
    table = iter->get();
  } else {
    // Start from a potentially empty table.
    Address initial = upTo(10);
    // Make the max potentially higher, or unlimited.
    Address max;
    if (oneIn(2)) {
      max = initial + upTo(4);
    } else {
      max = Memory::kUnlimitedSize;
    }
    // Fuzz wasm64 when possible, sometimes.
    auto addressType = Type::i32;
    if (wasm.features.hasMemory64() && oneIn(2)) {
      addressType = Type::i64;
    }
    auto tablePtr =
      builder.makeTable(Names::getValidTableName(wasm, "fuzzing_table"),
                        funcref,
                        initial,
                        max,
                        addressType);
    tablePtr->hasExplicitName = true;
    table = wasm.addTable(std::move(tablePtr));
  }
  funcrefTableName = table->name;
  bool hasFuncrefElemSegment =
    std::any_of(wasm.elementSegments.begin(),
                wasm.elementSegments.end(),
                [&](auto& segment) {
                  return segment->table.is() && segment->type == funcref;
                });
  auto addressType = wasm.getTable(funcrefTableName)->addressType;
  if (!hasFuncrefElemSegment) {
    // TODO: use a random table
    auto segment = std::make_unique<ElementSegment>(
      table->name, builder.makeConst(Literal::makeFromInt32(0, addressType)));
    segment->setName(Names::getValidElementSegmentName(wasm, "elem$"), false);
    wasm.addElementSegment(std::move(segment));
  }

  // When EH is enabled, set up an exnref table.
  if (wasm.features.hasExceptionHandling()) {
    Type exnref = Type(HeapType::exn, Nullable);
    auto iter =
      std::find_if(wasm.tables.begin(), wasm.tables.end(), [&](auto& table) {
        return table->type == exnref;
      });
    if (iter != wasm.tables.end()) {
      // Use the existing one.
      exnrefTableName = iter->get()->name;
    } else {
      // Create a new exnref table.
      Address initial = upTo(10);
      Address max = oneIn(2) ? initial + upTo(4) : Memory::kUnlimitedSize;
      auto tablePtr =
        builder.makeTable(Names::getValidTableName(wasm, "exnref_table"),
                          exnref,
                          initial,
                          max,
                          Type::i32); // TODO: wasm64
      tablePtr->hasExplicitName = true;
      table = wasm.addTable(std::move(tablePtr));
      exnrefTableName = table->name;
    }
  }
}